

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t encoder_init(aom_codec_ctx_t *ctx)

{
  aom_codec_enc_cfg_t *cfg;
  av1_extracfg *extra_cfg;
  AV1EncoderConfig *oxcf;
  uint uVar1;
  int iVar2;
  aom_codec_err_t aVar3;
  aom_codec_alg_priv_t_conflict *ctx_00;
  AV1_PRIMARY *pAVar4;
  FIRSTPASS_STATS *pFVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  aom_codec_err_t aVar15;
  
  aVar3 = AOM_CODEC_OK;
  if (ctx->priv == (aom_codec_priv_t *)0x0) {
    ctx_00 = (aom_codec_alg_priv_t_conflict *)aom_calloc(1,0xb528);
    aVar15 = AOM_CODEC_MEM_ERROR;
    aVar3 = aVar15;
    if (ctx_00 != (aom_codec_alg_priv_t_conflict *)0x0) {
      ctx->priv = (aom_codec_priv_t *)ctx_00;
      (ctx_00->base).init_flags = ctx->init_flags;
      cfg = &ctx_00->cfg;
      memcpy(cfg,(ctx->config).raw,0x388);
      (ctx->config).dec = (aom_codec_dec_cfg *)cfg;
      extra_cfg = &ctx_00->extra_cfg;
      memcpy(extra_cfg,&default_extra_cfg,600);
      uVar6 = (ctx_00->cfg).g_usage;
      if (uVar6 == 2) {
        (ctx_00->extra_cfg).enable_cdef = 0;
        (ctx_00->extra_cfg).qm_min = 4;
        (ctx_00->extra_cfg).qm_max = 10;
      }
      av1_initialize_enc(uVar6,(ctx_00->cfg).rc_end_usage);
      aVar3 = validate_config(ctx_00,cfg,extra_cfg);
      if (aVar3 == AOM_CODEC_OK) {
        ctx_00->num_lap_buffers = 0;
        uVar6 = (ctx_00->cfg).g_timebase.den;
        uVar11 = (long)(ctx_00->cfg).g_timebase.num * 10000000;
        uVar9 = (ulong)uVar6;
        uVar14 = uVar11;
        while (0 < (int)uVar9) {
          uVar12 = uVar9 & 0xffffffff;
          uVar9 = (long)uVar14 % (long)uVar12;
          uVar14 = uVar12;
        }
        (ctx_00->timestamp_ratio).num = (long)uVar11 / (long)(int)uVar14;
        (ctx_00->timestamp_ratio).den = (int)uVar6 / (int)uVar14;
        oxcf = &ctx_00->oxcf;
        set_encoder_config(oxcf,cfg,extra_cfg);
        iVar13 = 0;
        if ((((ctx_00->oxcf).rc_cfg.mode != AOM_CBR) && ((ctx_00->oxcf).pass == AOM_RC_ONE_PASS)) &&
           ((ctx_00->oxcf).mode == '\0')) {
          iVar13 = (ctx_00->oxcf).kf_cfg.key_freq_max;
          uVar6 = iVar13 + 0x10;
          if (0x20 < iVar13) {
            uVar6 = 0x30;
          }
          uVar1 = (ctx_00->cfg).g_lag_in_frames;
          if ((int)uVar1 < (int)uVar6) {
            uVar6 = uVar1;
          }
          ctx_00->num_lap_buffers = uVar6;
          iVar13 = 0x11;
          if ((int)(uVar1 - uVar6) < 0x11) {
            iVar13 = 0;
          }
        }
        (ctx_00->oxcf).use_highbitdepth = (_Bool)((byte)((uint)ctx->init_flags >> 0x12) & 1);
        ctx_00->monochrome_on_init = (ctx_00->cfg).monochrome != 0;
        pAVar4 = av1_create_primary_compressor
                           (&(ctx_00->pkt_list).head,ctx_00->num_lap_buffers,oxcf);
        ctx_00->ppi = pAVar4;
        aVar3 = aVar15;
        if (pAVar4 != (AV1_PRIMARY *)0x0) {
          uVar6 = ctx_00->num_lap_buffers + 1;
          if (ctx_00->num_lap_buffers < 1) {
            uVar6 = 0x30;
          }
          pFVar5 = (FIRSTPASS_STATS *)aom_calloc((long)(int)uVar6,0xe8);
          ctx_00->frame_stats_buffer = pFVar5;
          if (pFVar5 != (FIRSTPASS_STATS *)0x0) {
            (ctx_00->stats_buf_context).stats_in_start = pFVar5;
            (ctx_00->stats_buf_context).stats_in_end = pFVar5;
            (ctx_00->stats_buf_context).stats_in_buf_end = pFVar5 + (int)uVar6;
            pFVar5 = (FIRSTPASS_STATS *)aom_calloc(1,0xe8);
            (ctx_00->stats_buf_context).total_left_stats = pFVar5;
            if (pFVar5 != (FIRSTPASS_STATS *)0x0) {
              av1_twopass_zero_stats(pFVar5);
              pFVar5 = (FIRSTPASS_STATS *)aom_calloc(1,0xe8);
              (ctx_00->stats_buf_context).total_stats = pFVar5;
              if (pFVar5 != (FIRSTPASS_STATS *)0x0) {
                av1_twopass_zero_stats(pFVar5);
                iVar2 = ctx_00->num_lap_buffers;
                iVar7 = -1;
                if (-1 < iVar2) {
                  iVar7 = iVar2;
                }
                uVar14 = 0x30;
                if (0 < iVar2) {
                  uVar14 = (ulong)(iVar7 + 1);
                }
                lVar8 = 0xb79;
                for (lVar10 = 0; uVar14 * 0xe8 - lVar10 != 0; lVar10 = lVar10 + 0xe8) {
                  ctx_00->ppi->parallel_cpi[lVar8] =
                       (AV1_COMP *)((long)&ctx_00->frame_stats_buffer->frame + lVar10);
                  lVar8 = lVar8 + 1;
                }
                pAVar4 = ctx_00->ppi;
                (pAVar4->twopass).stats_buf_ctx = &ctx_00->stats_buf_context;
                aVar3 = av1_create_context_and_bufferpool
                                  (pAVar4,pAVar4->parallel_cpi,&ctx_00->buffer_pool,oxcf,'\0',-1);
                if (aVar3 == AOM_CODEC_OK) {
                  pAVar4 = ctx_00->ppi;
                  (pAVar4->parallel_cpi[0]->twopass_frame).stats_in =
                       ((pAVar4->twopass).stats_buf_ctx)->stats_in_start;
                  pAVar4->cpi = pAVar4->parallel_cpi[0];
                  aVar3 = AOM_CODEC_OK;
                  if (ctx_00->num_lap_buffers != 0) {
                    aVar3 = av1_create_context_and_bufferpool
                                      (pAVar4,&pAVar4->cpi_lap,&ctx_00->buffer_pool_lap,oxcf,'\x01',
                                       iVar13);
                    return aVar3;
                  }
                }
                else {
                  (ctx_00->base).err_detail = "av1_create_context_and_bufferpool() failed";
                }
              }
            }
          }
        }
      }
    }
  }
  return aVar3;
}

Assistant:

static aom_codec_err_t encoder_init(aom_codec_ctx_t *ctx) {
  aom_codec_err_t res = AOM_CODEC_OK;

  if (ctx->priv == NULL) {
    aom_codec_alg_priv_t *const priv = aom_calloc(1, sizeof(*priv));
    if (priv == NULL) return AOM_CODEC_MEM_ERROR;

    ctx->priv = (aom_codec_priv_t *)priv;
    ctx->priv->init_flags = ctx->init_flags;

    // Update the reference to the config structure to an internal copy.
    assert(ctx->config.enc);
    priv->cfg = *ctx->config.enc;
    ctx->config.enc = &priv->cfg;

    priv->extra_cfg = default_extra_cfg;
    // Special handling:
    // By default, if omitted: --enable-cdef=1, --qm-min=5, and --qm-max=9
    // Here we set its default values to 0, 4, and 10 respectively when
    // --allintra is turned on.
    // However, if users set --enable-cdef, --qm-min, or --qm-max, either from
    // the command line or aom_codec_control(), the encoder still respects it.
    if (priv->cfg.g_usage == AOM_USAGE_ALL_INTRA) {
      // CDEF has been found to blur images, so it's disabled in all-intra mode
      priv->extra_cfg.enable_cdef = 0;
      // These QM min/max values have been found to be beneficial for images,
      // when used with an alternative QM formula (see
      // aom_get_qmlevel_allintra()).
      // These values could also be beneficial for other usage modes, but
      // further testing is required.
      priv->extra_cfg.qm_min = DEFAULT_QM_FIRST_ALLINTRA;
      priv->extra_cfg.qm_max = DEFAULT_QM_LAST_ALLINTRA;
    }
    av1_initialize_enc(priv->cfg.g_usage, priv->cfg.rc_end_usage);

    res = validate_config(priv, &priv->cfg, &priv->extra_cfg);

    if (res == AOM_CODEC_OK) {
      int *num_lap_buffers = &priv->num_lap_buffers;
      int lap_lag_in_frames = 0;
      *num_lap_buffers = 0;
      priv->timestamp_ratio.den = priv->cfg.g_timebase.den;
      priv->timestamp_ratio.num =
          (int64_t)priv->cfg.g_timebase.num * TICKS_PER_SEC;
      reduce_ratio(&priv->timestamp_ratio);

      set_encoder_config(&priv->oxcf, &priv->cfg, &priv->extra_cfg);
      if (priv->oxcf.rc_cfg.mode != AOM_CBR &&
          priv->oxcf.pass == AOM_RC_ONE_PASS && priv->oxcf.mode == GOOD) {
        // Enable look ahead - enabled for AOM_Q, AOM_CQ, AOM_VBR
        *num_lap_buffers =
            AOMMIN((int)priv->cfg.g_lag_in_frames,
                   AOMMIN(MAX_LAP_BUFFERS, priv->oxcf.kf_cfg.key_freq_max +
                                               SCENE_CUT_KEY_TEST_INTERVAL));
        if ((int)priv->cfg.g_lag_in_frames - (*num_lap_buffers) >=
            LAP_LAG_IN_FRAMES) {
          lap_lag_in_frames = LAP_LAG_IN_FRAMES;
        }
      }
      priv->oxcf.use_highbitdepth =
          (ctx->init_flags & AOM_CODEC_USE_HIGHBITDEPTH) ? 1 : 0;

      priv->monochrome_on_init = priv->cfg.monochrome;

      priv->ppi = av1_create_primary_compressor(&priv->pkt_list.head,
                                                *num_lap_buffers, &priv->oxcf);
      if (!priv->ppi) return AOM_CODEC_MEM_ERROR;

#if !CONFIG_REALTIME_ONLY
      res = create_stats_buffer(&priv->frame_stats_buffer,
                                &priv->stats_buf_context, *num_lap_buffers);
      if (res != AOM_CODEC_OK) return res;

      assert(MAX_LAP_BUFFERS >= MAX_LAG_BUFFERS);
      int size = get_stats_buf_size(*num_lap_buffers, MAX_LAG_BUFFERS);
      for (int i = 0; i < size; i++)
        priv->ppi->twopass.frame_stats_arr[i] = &priv->frame_stats_buffer[i];

      priv->ppi->twopass.stats_buf_ctx = &priv->stats_buf_context;
#endif

      assert(priv->ppi->num_fp_contexts >= 1);
      res = av1_create_context_and_bufferpool(
          priv->ppi, &priv->ppi->parallel_cpi[0], &priv->buffer_pool,
          &priv->oxcf, ENCODE_STAGE, -1);
      if (res != AOM_CODEC_OK) {
        priv->base.err_detail = "av1_create_context_and_bufferpool() failed";
        return res;
      }
#if !CONFIG_REALTIME_ONLY
      priv->ppi->parallel_cpi[0]->twopass_frame.stats_in =
          priv->ppi->twopass.stats_buf_ctx->stats_in_start;
#endif
      priv->ppi->cpi = priv->ppi->parallel_cpi[0];

      // Create another compressor if look ahead is enabled
      if (res == AOM_CODEC_OK && *num_lap_buffers) {
        res = av1_create_context_and_bufferpool(
            priv->ppi, &priv->ppi->cpi_lap, &priv->buffer_pool_lap, &priv->oxcf,
            LAP_STAGE, clamp(lap_lag_in_frames, 0, MAX_LAG_BUFFERS));
      }
    }
  }

  return res;
}